

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O1

void Diligent::MultiDrawArrays
               (GLenum GlTopology,GLsizei DrawCount,GLsizei *NumVertices,GLint *StartVertexLocation,
               GLsizei NumInstances,GLuint FirstInstanceLocation)

{
  GLenum err;
  string msg;
  uint local_3c;
  string local_38;
  
  if (NumInstances < 2 && FirstInstanceLocation == 0) {
    (*__glewMultiDrawArrays)(GlTopology,StartVertexLocation,NumVertices,DrawCount);
  }
  else {
    FormatString<char[58]>
              (&local_38,(char (*) [58])"Instanced multi-draw is not currently supported in OpenGL")
    ;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"MultiDrawArrays",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x38c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  local_3c = glGetError();
  if (local_3c != 0) {
    LogError<false,char[23],char[17],unsigned_int>
              (false,"MultiDrawArrays",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x393,(char (*) [23])"MultiDrawArrays failed",(char (*) [17])"\nGL Error Code: ",
               &local_3c);
    FormatString<char[6]>(&local_38,(char (*) [6])0x861532);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"MultiDrawArrays",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x393);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

inline void MultiDrawArrays(GLenum         GlTopology,
                            GLsizei        DrawCount,
                            const GLsizei* NumVertices,
                            const GLint*   StartVertexLocation,
                            GLsizei        NumInstances,
                            GLuint         FirstInstanceLocation)
{
    if (NumInstances > 1 || FirstInstanceLocation != 0)
    {
        UNSUPPORTED("Instanced multi-draw is not currently supported in OpenGL");
    }
    else
    {
        glMultiDrawArrays(GlTopology, StartVertexLocation, NumVertices, DrawCount);
    }

    DEV_CHECK_GL_ERROR("MultiDrawArrays failed");
}